

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_upgrade_tls(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  CURLcode CVar2;
  _Bool local_25;
  CURLcode local_24;
  _Bool ssldone;
  anon_union_280_10_9f9d5394_for_proto *paStack_20;
  CURLcode result;
  imap_conn *imapc;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  paStack_20 = &conn->proto;
  local_25 = false;
  imapc = (imap_conn *)conn;
  conn_local = (connectdata *)data;
  _Var1 = Curl_conn_is_ssl(conn,0);
  if (!_Var1) {
    CVar2 = Curl_ssl_cfilter_add((Curl_easy *)conn_local,(connectdata *)imapc,0);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    local_24 = 0;
  }
  local_24 = Curl_conn_connect((Curl_easy *)conn_local,0,false,&local_25);
  if (local_24 == CURLE_OK) {
    *(byte *)((long)paStack_20 + 0xfb) = *(byte *)((long)paStack_20 + 0xfb) & 0xfe | local_25 & 1U;
    if ((paStack_20->imapc).state != IMAP_UPGRADETLS) {
      imap_state((Curl_easy *)conn_local,IMAP_UPGRADETLS);
    }
    if ((*(byte *)((long)paStack_20 + 0xfb) & 1) != 0) {
      imap_to_imaps((connectdata *)imapc);
      local_24 = imap_perform_capability((Curl_easy *)conn_local,(connectdata *)imapc);
    }
  }
  return local_24;
}

Assistant:

static CURLcode imap_perform_upgrade_tls(struct Curl_easy *data,
                                         struct connectdata *conn)
{
  /* Start the SSL connection */
  struct imap_conn *imapc = &conn->proto.imapc;
  CURLcode result;
  bool ssldone = FALSE;

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
    if(result)
      goto out;
  }

  result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
  if(!result) {
    imapc->ssldone = ssldone;
    if(imapc->state != IMAP_UPGRADETLS)
      imap_state(data, IMAP_UPGRADETLS);

    if(imapc->ssldone) {
      imap_to_imaps(conn);
      result = imap_perform_capability(data, conn);
    }
  }
out:
  return result;
}